

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Statement.cpp
# Opt level: O2

void __thiscall SQLite::Statement::bindNoCopy(Statement *this,char *apName,char *apValue)

{
  int iVar1;
  
  iVar1 = sqlite3_bind_parameter_index((this->mStmtPtr).mpStmt,apName);
  iVar1 = sqlite3_bind_text((this->mStmtPtr).mpStmt,iVar1,apValue,-1,(_func_void_void_ptr *)0x0);
  check(this,iVar1);
  return;
}

Assistant:

void Statement::bindNoCopy(const char* apName, const char* apValue)
{
    const int index = sqlite3_bind_parameter_index(mStmtPtr, apName);
    const int ret = sqlite3_bind_text(mStmtPtr, index, apValue, -1, SQLITE_STATIC);
    check(ret);
}